

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_error.cpp
# Opt level: O3

Error * ot::commissioner::ErrorFromMbedtlsError(Error *__return_storage_ptr__,int aMbedtlsError)

{
  size_t sVar1;
  ErrorCode EVar2;
  char mbedtlsErrorMsg [257];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  char local_138 [272];
  
  if (0 < aMbedtlsError) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/mbedtls_error.cpp"
                  ,0x41,"Error ot::commissioner::ErrorFromMbedtlsError(int)");
  }
  EVar2 = kIOBusy;
  if (aMbedtlsError < -0x6880) {
    if ((aMbedtlsError == -0x7000) || (aMbedtlsError == -0x6900)) goto LAB_001c013d;
  }
  else {
    if ((aMbedtlsError == -0x6880) || (aMbedtlsError == -0x6500)) goto LAB_001c013d;
    if (aMbedtlsError == 0) {
      mbedtls_strerror(0,local_138,0x101);
      __return_storage_ptr__->mCode = kNone;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      (__return_storage_ptr__->mMessage)._M_string_length = 0;
      (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  }
  EVar2 = kIOError;
  if (0x10 < aMbedtlsError + 0x52U) {
    EVar2 = kUnknown;
    if ((aMbedtlsError - 1U & 0x6000) == 0) {
      EVar2 = kSecurity;
    }
  }
LAB_001c013d:
  mbedtls_strerror(aMbedtlsError,local_138,0x101);
  local_158 = local_148;
  sVar1 = strlen(local_138);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,local_138,local_138 + sVar1);
  __return_storage_ptr__->mCode = EVar2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->mMessage,local_158,local_158 + local_150);
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ErrorFromMbedtlsError(int aMbedtlsError)
{
    // See <mbedtls/error.h> for the constants.
    static constexpr int kMbedtlsErrorLowLevelNetBegin        = -0x0052;
    static constexpr int kMbedtlsErrorLowLevelNetEnd          = -0x0042;
    static constexpr int kMbedtlsErrorHighLevelModuleIdMask   = 0x7000;
    static constexpr int kMbedtlsErrorHighLevelModuleIdOffset = 12;
    static constexpr int kMbedtlsErrorHighLevelModuleIdCipher = 6;
    static constexpr int kMbedtlsErrorHighLevelModuleIdSsl    = 7;
    static constexpr int kMbedtlsErrorMsgMaxLength            = 256;

    ASSERT(aMbedtlsError <= 0);

    ErrorCode errorCode;

    uint16_t highLevelModuleId = (static_cast<uint16_t>(-aMbedtlsError) & kMbedtlsErrorHighLevelModuleIdMask) >>
                                 kMbedtlsErrorHighLevelModuleIdOffset;

    if (aMbedtlsError == 0)
    {
        errorCode = ErrorCode::kNone;
    }
    else if (aMbedtlsError == MBEDTLS_ERR_SSL_WANT_READ || aMbedtlsError == MBEDTLS_ERR_SSL_WANT_WRITE ||
             aMbedtlsError == MBEDTLS_ERR_SSL_ASYNC_IN_PROGRESS || aMbedtlsError == MBEDTLS_ERR_SSL_CRYPTO_IN_PROGRESS)
    {
        errorCode = ErrorCode::kIOBusy;
        ;
    }
    else if (aMbedtlsError >= kMbedtlsErrorLowLevelNetBegin && aMbedtlsError <= kMbedtlsErrorLowLevelNetEnd)
    {
        // Low-level NET error.
        errorCode = ErrorCode::kIOError;
    }
    else if (highLevelModuleId == kMbedtlsErrorHighLevelModuleIdCipher ||
             highLevelModuleId == kMbedtlsErrorHighLevelModuleIdSsl)
    {
        // High-level SSL or CIPHER error.
        errorCode = ErrorCode::kSecurity;
    }
    else
    {
        errorCode = ErrorCode::kUnknown;
    }

    char mbedtlsErrorMsg[kMbedtlsErrorMsgMaxLength + 1];
    mbedtls_strerror(aMbedtlsError, mbedtlsErrorMsg, sizeof(mbedtlsErrorMsg));

    return errorCode == ErrorCode::kNone ? ERROR_NONE : Error{errorCode, mbedtlsErrorMsg};
}